

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::ProgramUniformCase::generateUniformFragSrc
          (ProgramUniformCase *this,string *outFragSrc,GLSLVersion glslVersion,DataType dType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  StringTemplate fragTmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream fragSrc;
  undefined1 auStack_258 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  allocator<char> local_209;
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar3 = glu::getGLSLVersionDeclaration(glslVersion);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)(auStack_258 + (long)*(_func_int **)(local_198._0_8_ + -0x18)) + 0xc0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  bVar6 = 8 < dType - TYPE_FLOAT_MAT2;
  bVar7 = 8 < dType - TYPE_DOUBLE_MAT2;
  if (bVar7 && bVar6) {
LAB_00bee819:
    lVar5 = 0x655;
    pcVar3 = 
    "precision highp float;\nuniform ${SCALAR_TYPE}  uVal0;\nuniform ${VECTOR_TYPE}2 uVal1;\nuniform ${VECTOR_TYPE}3 uVal2;\nuniform ${VECTOR_TYPE}4 uVal3;\n\nuniform ${SCALAR_TYPE}  uVal4[2];\nuniform ${VECTOR_TYPE}2 uVal5[2];\nuniform ${VECTOR_TYPE}3 uVal6[2];\nuniform ${VECTOR_TYPE}4 uVal7[2];\n\nconst ${SCALAR_TYPE}  kVal0= 1${SFX};\nconst ${VECTOR_TYPE}2 kVal1 = ${VECTOR_TYPE}2(2${SFX}, 3${SFX});\nconst ${VECTOR_TYPE}3 kVal2 = ${VECTOR_TYPE}3(4${SFX}, 5${SFX}, 6${SFX});\nconst ${VECTOR_TYPE}4 kVal3 = ${VECTOR_TYPE}4(7${SFX}, 8${SFX}, 9${SFX}, 10${SFX});\n\nconst ${SCALAR_TYPE}  kArr4_0 = 11${SFX};\nconst ${SCALAR_TYPE}  kArr4_1 = 12${SFX};\nconst ${VECTOR_TYPE}2 kArr5_0 = ${VECTOR_TYPE}2(13${SFX}, 14${SFX});\nconst ${VECTOR_TYPE}2 kArr5_1 = ${VECTOR_TYPE}2(15${SFX}, 16${SFX});\nconst ${VECTOR_TYPE}3 kArr6_0 = ${VECTOR_TYPE}3(17${SFX}, 18${SFX}, 19${SFX});\nconst ${VECTOR_TYPE}3 kArr6_1 = ${VECTOR_TYPE}3(20${SFX}, 21${SFX}, 22${SFX});\nconst ${VECTOR_TYPE}4 kArr7_0 = ${VECTOR_TYPE}4(23${SFX}, 24${SFX}, 25${SFX}, 26${SFX});\nconst ${VECTOR_TYPE}4 kArr7_1 = ${VECTOR_TYPE}4(27${SFX}, 28${SFX}, 29${SFX}, 30${SFX});\n\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main() {\n    if ((uVal0 != kVal0) ||\n        (uVal1 != kVal1) ||\n        (uVal2 != kVal2) ||\n        (uVal3 != kVal3) ||\n        (uVal4[0] != kArr4_0) || (uVal4[1] != kArr4_1) ||\n        (uVal5[0] != kArr5_0) || (uVal5[1] != kArr5_1) ||\n        (uVal6[0] != kArr6_0) || (uVal6[1] != kArr6_1) ||\n        (uVal7[0] != kArr7_0) || (uVal7[1] != kArr7_1)) {\n        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n    } else {\n        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n    }\n}\n"
    ;
  }
  else {
    if ((TYPE_FLOAT_MAT4 < dType) || ((0x2220U >> (dType & TYPE_UINT) & 1) == 0)) {
      if (!bVar7 || !bVar6) {
        lVar5 = 0xb40;
        pcVar3 = 
        "precision highp float;\nuniform mat2x3 uValM2x3[2];\nuniform mat3x2 uValM3x2[2];\nuniform mat2x4 uValM2x4[2];\nuniform mat4x2 uValM4x2[2];\nuniform mat3x4 uValM3x4[2];\nuniform mat4x3 uValM4x3[2];\n\nconst mat2x3 kMat2x3_0 = mat2x3(vec2(149.0, 150.0),\n                                vec2(151.0, 152.0),\n                                vec2(153.0, 154.0));\nconst mat2x3 kMat2x3_1 = mat2x3(vec2(155.0, 156.0),\n                                vec2(157.0, 158.0),\n                                vec2(159.0, 160.0));\nconst mat3x2 kMat3x2_0 = mat3x2(vec3(161.0, 162.0, 163.0),\n                                vec3(164.0, 165.0, 166.0));\nconst mat3x2 kMat3x2_1 = mat3x2(vec3(167.0, 168.0, 169.0),\n                                vec3(170.0, 171.0, 172.0));\nconst mat2x4 kMat2x4_0 = mat2x4(vec2(173.0, 174.0),\n                                vec2(175.0, 176.0),\n                                vec2(177.0, 178.0),\n                                vec2(179.0, 180.0));\nconst mat2x4 kMat2x4_1 = mat2x4(vec2(181.0, 182.0),\n                                vec2(183.0, 184.0),\n                                vec2(185.0, 186.0),\n                                vec2(187.0, 188.0));\nconst mat4x2 kMat4x2_0 = mat4x2(vec4(189.0, 190.0, 191.0, 192.0),\n                                vec4(193.0, 194.0, 195.0, 196.0));\nconst mat4x2 kMat4x2_1 = mat4x2(vec4(197.0, 198.0, 199.0, 200.0),\n                                vec4(201.0, 202.0, 203.0, 204.0));\nconst mat3x4 kMat3x4_0 = mat3x4(vec3(205.0, 206.0, 207.0),\n                                vec3(208.0, 209.0, 210.0),\n                                vec3(211.0, 212.0, 213.0),\n                                vec3(214.0, 215.0, 216.0));\nconst mat3x4 kMat3x4_1 = mat3x4(vec3(217.0, 218.0, 219.0),\n                                vec3(220.0, 221.0, 222.0),\n                                vec3(223.0, 224.0, 225.0),\n                                vec3(226.0, 227.0, 228.0));\nconst mat4x3 kMat4x3_0 = mat4x3(vec4(229.0, 230.0, 231.0, 232.0),\n                                vec4(233.0, 234.0, 235.0, 236.0),\n              ..." /* TRUNCATED STRING LITERAL */
        ;
        if ((TYPE_FLOAT_MAT4 < dType) || ((0x2220U >> (dType & TYPE_UINT) & 1) == 0))
        goto LAB_00bee825;
      }
      goto LAB_00bee819;
    }
    lVar5 = 0x548;
    pcVar3 = 
    "precision highp float;\nuniform mat2 uValM2[2];\nuniform mat3 uValM3[2];\nuniform mat4 uValM4[2];\n\nconst mat2 kMat2_0 = mat2(91.0, 92.0, 93.0, 94.0);\nconst mat2 kMat2_1 = mat2(95.0, 96.0, 97.0, 98.0);\nconst mat3 kMat3_0 = mat3(vec3( 99.0, 100.0, 101.0),\n                          vec3(102.0, 103.0, 104.0),\n                          vec3(105.0, 106.0, 107.0));\nconst mat3 kMat3_1 = mat3(vec3(108.0, 109.0, 110.0),\n                          vec3(111.0, 112.0, 113.0),\n                          vec3(114.0, 115.0, 116.0));\nconst mat4 kMat4_0 = mat4(vec4(117.0, 118.0, 119.0, 120.0),\n                          vec4(121.0, 122.0, 123.0, 124.0),\n                          vec4(125.0, 126.0, 127.0, 128.0),\n                          vec4(129.0, 130.0, 131.0, 132.0));\nconst mat4 kMat4_1 = mat4(vec4(133.0, 134.0, 135.0, 136.0),\n                          vec4(137.0, 138.0, 139.0, 140.0),\n                          vec4(141.0, 142.0, 143.0, 144.0),\n                          vec4(145.0, 146.0, 147.0, 148.0));\n\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main() {\n    if ((uValM2[0] != kMat2_0) || (uValM2[1] != kMat2_1) ||\n        (uValM3[0] != kMat3_0) || (uValM3[1] != kMat3_1) ||\n        (uValM4[0] != kMat4_0) || (uValM4[1] != kMat4_1)) {\n        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n    } else {\n        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n    }\n}\n"
    ;
  }
LAB_00bee825:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,lVar5);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (dType == TYPE_FLOAT) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[6],_true>
              (&local_250,(char (*) [12])"SCALAR_TYPE",(char (*) [6])0x1b10a98);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    paVar1 = &local_250.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_250.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[4],_true>
              (&local_250,(char (*) [12])"VECTOR_TYPE",(char (*) [4])0x1c0039d);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
              (&local_250,(char (*) [4])"SFX",(char (*) [3])0x1c78082);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
  }
  else if (dType == TYPE_UINT) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_250,(char (*) [12])"SCALAR_TYPE",(char (*) [5])0x1adb600);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    paVar1 = &local_250.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_250.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_250,(char (*) [12])"VECTOR_TYPE",(char (*) [5])0x1c8ce1c);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[2],_true>
              (&local_250,(char (*) [4])"SFX",(char (*) [2])0x1b19cf4);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
  }
  else {
    if (dType != TYPE_INT) goto LAB_00beeb30;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[4],_true>
              (&local_250,(char (*) [12])"SCALAR_TYPE",(char (*) [4])0x1c86081);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    paVar1 = &local_250.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_250.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_250,(char (*) [12])"VECTOR_TYPE",(char (*) [5])0x1c319c7);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.second._M_dataplus._M_p,
                      local_250.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[1],_true>
              (&local_250,(char (*) [4])"SFX",(char (*) [1])(fixed_sample_locations_values + 1));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&local_1e8,&local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second._M_dataplus._M_p != &local_250.second.field_2) {
    operator_delete(local_250.second._M_dataplus._M_p,
                    local_250.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
LAB_00beeb30:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,(char *)local_1b8,&local_209);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_250,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  tcu::StringTemplate::specialize
            (&local_208,(StringTemplate *)&local_250,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1e8);
  std::__cxx11::string::operator=((string *)outFragSrc,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_250);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void generateUniformFragSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion, glu::DataType dType)
	{
		std::ostringstream fragSrc;

		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (isDataTypeMatrix(dType) && isDataTypeSquareMatrix(dType))
		{
			fragSrc << s_unifFragSquareMatShaderSrc;
		}
		else if (isDataTypeMatrix(dType) && !isDataTypeSquareMatrix(dType))
		{
			fragSrc << s_unifFragNonSquareMatShaderSrc;
		}
		else
		{
			fragSrc << s_unifFragShaderSrc;
		}

		std::map<std::string, std::string> params;

		if (dType == glu::TYPE_INT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "int"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "ivec"));
			params.insert(std::pair<std::string, std::string>("SFX", ""));
		}
		else if (dType == glu::TYPE_UINT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "uint"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "uvec"));
			params.insert(std::pair<std::string, std::string>("SFX", "u"));
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "float"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "vec"));
			params.insert(std::pair<std::string, std::string>("SFX", ".0"));
		}

		tcu::StringTemplate fragTmpl(fragSrc.str().c_str());
		outFragSrc = fragTmpl.specialize(params);
	}